

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditBuildInfoTests.cpp
# Opt level: O0

char * dit::getCpuName(int cpu)

{
  char *pcStack_10;
  int cpu_local;
  
  switch(cpu) {
  case 0:
    pcStack_10 = "DE_CPU_VANILLA";
    break;
  case 1:
    pcStack_10 = "DE_CPU_X86";
    break;
  case 2:
    pcStack_10 = "DE_CPU_ARM";
    break;
  case 3:
    pcStack_10 = "DE_CPU_X86_64";
    break;
  case 4:
    pcStack_10 = "DE_CPU_ARM_64";
    break;
  case 5:
    pcStack_10 = "DE_CPU_MIPS";
    break;
  case 6:
    pcStack_10 = "DE_CPU_MIPS_64";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static const char* getCpuName (int cpu)
{
	switch (cpu)
	{
		case DE_CPU_VANILLA:	return "DE_CPU_VANILLA";
		case DE_CPU_ARM:		return "DE_CPU_ARM";
		case DE_CPU_X86:		return "DE_CPU_X86";
		case DE_CPU_X86_64:		return "DE_CPU_X86_64";
		case DE_CPU_ARM_64:		return "DE_CPU_ARM_64";
		case DE_CPU_MIPS:		return "DE_CPU_MIPS";
		case DE_CPU_MIPS_64:	return "DE_CPU_MIPS_64";
		default:
			return DE_NULL;
	}
}